

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_precision_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  SPIRType *type;
  SPIRType *pSVar1;
  mapped_type *pmVar2;
  key_type local_24;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  if ((((this->backend).allow_precision_qualifiers == true) && ((type->basetype & ~Void) == Image))
     && (pSVar1 = Variant::get<diligent_spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             (type->image).type.id), pSVar1->width < 0x20)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"mediump ","");
    return __return_storage_ptr__;
  }
  pmVar2 = ::std::__detail::
           _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&local_24);
  flags_to_qualifiers_glsl_abi_cxx11_
            (__return_storage_ptr__,this,type,&(pmVar2->decoration).decoration_flags);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_precision_qualifiers_glsl(uint32_t id)
{
	auto &type = expression_type(id);
	bool use_precision_qualifiers = backend.allow_precision_qualifiers;
	if (use_precision_qualifiers && (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage))
	{
		// Force mediump for the sampler type. We cannot declare 16-bit or smaller image types.
		auto &result_type = get<SPIRType>(type.image.type);
		if (result_type.width < 32)
			return "mediump ";
	}
	return flags_to_qualifiers_glsl(type, ir.meta[id].decoration.decoration_flags);
}